

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O1

int nni_msg_realloc(nni_msg *m,size_t sz)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar1 = (m->m_body).ch_len;
  if (uVar1 < sz) {
    iVar3 = nni_chunk_append(&m->m_body,(void *)0x0,sz - uVar1);
    if (iVar3 != 0) {
      return iVar3;
    }
  }
  else {
    uVar2 = (m->m_body).ch_len;
    if (uVar1 - sz <= uVar2) {
      (m->m_body).ch_len = uVar2 - (uVar1 - sz);
    }
  }
  return 0;
}

Assistant:

int
nni_msg_realloc(nni_msg *m, size_t sz)
{
	if (m->m_body.ch_len < sz) {
		int rv =
		    nni_chunk_append(&m->m_body, NULL, sz - m->m_body.ch_len);
		if (rv != 0) {
			return (rv);
		}
	} else {
		// "Shrinking", just mark bytes at end usable again.
		nni_chunk_chop(&m->m_body, m->m_body.ch_len - sz);
	}
	return (0);
}